

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O3

MPP_RET mpp_enc_ref_cfg_copy(MppEncRefCfg dst,MppEncRefCfg src)

{
  uint uVar1;
  uint uVar2;
  MPP_RET MVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  MPP_RET MVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  byte bVar10;
  
  bVar10 = 0;
  MVar3 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_copy",dst);
  MVar7 = MPP_ERR_VALUE;
  if (MVar3 == MPP_OK) {
    MVar3 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_copy",src);
    if (MVar3 == MPP_OK) {
      uVar1 = *(uint *)((long)src + 0x14);
      uVar2 = *(uint *)((long)src + 0x18);
      if (*(void **)((long)dst + 0x28) != (void *)0x0) {
        mpp_osal_free("mpp_enc_ref_cfg_copy",*(void **)((long)dst + 0x28));
      }
      *(undefined8 *)((long)dst + 0x28) = 0;
      if (*(void **)((long)dst + 0x30) != (void *)0x0) {
        mpp_osal_free("mpp_enc_ref_cfg_copy",*(void **)((long)dst + 0x30));
      }
      *(undefined8 *)((long)dst + 0x30) = 0;
      puVar8 = (undefined8 *)src;
      puVar9 = (undefined8 *)dst;
      for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
      }
      if (uVar1 == 0) {
        iVar6 = 0;
      }
      else {
        pvVar4 = mpp_osal_calloc("mpp_enc_ref_cfg_copy",(long)(int)uVar1 * 0x18);
        if (pvVar4 == (void *)0x0) {
          _mpp_log_l(4,"mpp_enc_ref","failed to create %d lt ref cfg\n","mpp_enc_ref_cfg_copy",
                     (ulong)uVar1);
          iVar6 = -1;
        }
        else {
          memcpy(pvVar4,*(void **)((long)src + 0x28),(long)*(int *)((long)src + 0x14) * 0x18);
          iVar6 = 0;
        }
        *(void **)((long)dst + 0x28) = pvVar4;
      }
      if (uVar2 != 0) {
        pvVar4 = mpp_osal_calloc("mpp_enc_ref_cfg_copy",(long)(int)uVar2 * 0x14);
        if (pvVar4 == (void *)0x0) {
          _mpp_log_l(4,"mpp_enc_ref","failed to create %d st ref cfg\n","mpp_enc_ref_cfg_copy",
                     (ulong)uVar2);
          iVar6 = -1;
        }
        else {
          memcpy(pvVar4,*(void **)((long)src + 0x30),(long)*(int *)((long)src + 0x18) * 0x14);
        }
        *(void **)((long)dst + 0x30) = pvVar4;
      }
      if (iVar6 == 0) {
        MVar7 = MPP_OK;
      }
      else {
        mpp_enc_ref_cfg_reset(dst);
        MVar7 = MPP_NOK;
      }
    }
  }
  return MVar7;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_copy(MppEncRefCfg dst, MppEncRefCfg src)
{
    if (check_is_mpp_enc_ref_cfg(dst) || check_is_mpp_enc_ref_cfg(src))
        return MPP_ERR_VALUE;

    MPP_RET ret = MPP_OK;
    MppEncRefCfgImpl *d = (MppEncRefCfgImpl *)dst;
    MppEncRefCfgImpl *s = (MppEncRefCfgImpl *)src;
    RK_S32 max_lt_cfg = s->max_lt_cfg;
    RK_S32 max_st_cfg = s->max_st_cfg;

    /* step 1 - free cfg in dst */
    MPP_FREE(d->lt_cfg);
    MPP_FREE(d->st_cfg);

    /* step 2 - copy contex from src */
    memcpy(d, s, sizeof(*d));

    /* step 3 - create new storage and copy lt/st cfg */
    if (max_lt_cfg) {
        MppEncRefLtFrmCfg *lt_cfg = mpp_calloc(MppEncRefLtFrmCfg, max_lt_cfg);

        if (NULL == lt_cfg) {
            mpp_log_f("failed to create %d lt ref cfg\n", max_lt_cfg);
            ret = MPP_NOK;
        } else
            memcpy(lt_cfg, s->lt_cfg, sizeof(lt_cfg[0]) * s->max_lt_cfg);

        d->lt_cfg = lt_cfg;
    }

    if (max_st_cfg) {
        MppEncRefStFrmCfg *st_cfg = mpp_calloc(MppEncRefStFrmCfg, max_st_cfg);

        if (NULL == st_cfg) {
            mpp_log_f("failed to create %d st ref cfg\n", max_st_cfg);
            ret = MPP_NOK;
        } else
            memcpy(st_cfg, s->st_cfg, sizeof(st_cfg[0]) * s->max_st_cfg);

        d->st_cfg = st_cfg;
    }

    if (ret)
        mpp_enc_ref_cfg_reset(dst);

    return ret;
}